

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O0

int __thiscall basisu::histogram::init(histogram *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  bool grow_hint;
  vector<unsigned_int> *unaff_retaddr;
  
  grow_hint = SUB81((ulong)ctx >> 0x18,0);
  vector<unsigned_int>::resize(unaff_retaddr,(size_t)this,grow_hint);
  vector<unsigned_int>::resize(unaff_retaddr,(size_t)this,grow_hint);
  return extraout_EAX;
}

Assistant:

void init(uint32_t size)
		{
			m_hist.resize(0);
			m_hist.resize(size);
		}